

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::TextureCubeArray::TextureCubeArray(TextureCubeArray *this,TextureCubeArray *other)

{
  ConstPixelBufferAccess *pCVar1;
  int iVar2;
  
  TextureLevelPyramid::TextureLevelPyramid
            (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
  iVar2 = other->m_depth;
  this->m_size = other->m_size;
  this->m_depth = iVar2;
  pCVar1 = &((this->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
  (this->m_view).m_numLevels =
       (int)((ulong)((long)(this->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 3) *
       -0x33333333;
  (this->m_view).m_levels = pCVar1;
  return;
}

Assistant:

TextureCubeArray::TextureCubeArray (const TextureCubeArray& other)
	: TextureLevelPyramid	(other)
	, m_size				(other.m_size)
	, m_depth				(other.m_depth)
	, m_view				(getNumLevels(), getLevels())
{
	DE_ASSERT(m_depth % 6 == 0);
}